

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_preprocessing_for_filter_gain.cc
# Opt level: O0

bool __thiscall
sptk::InputSourcePreprocessingForFilterGain::Get
          (InputSourcePreprocessingForFilterGain *this,
          vector<double,_std::allocator<double>_> *buffer)

{
  ulong uVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar3;
  double inverse_of_b0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  anon_class_8_1_4d5477c7 in_stack_ffffffffffffffa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  bool local_1;
  
  if ((in_RSI == (vector<double,_std::allocator<double>_> *)0x0) ||
     (((ulong)in_RDI._M_current[3] & 1) == 0)) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(*(long *)in_RDI._M_current[2] + 0x20))((long *)in_RDI._M_current[2],in_RSI)
    ;
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      __result._M_current = (double *)(ulong)*(uint *)(in_RDI._M_current + 1);
      switch(__result._M_current) {
      case (double *)0x0:
        break;
      case (double *)0x1:
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        dVar3 = exp(*pvVar2);
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        *pvVar2 = dVar3;
        break;
      case (double *)0x2:
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
          return false;
        }
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        dVar3 = 1.0 / *pvVar2;
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        *pvVar2 = dVar3;
        break;
      case (double *)0x3:
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        *pvVar2 = 1.0;
        break;
      case (double *)0x4:
        pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
          return false;
        }
        ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
        ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
        ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
        ::std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::InputSourcePreprocessingForFilterGain::Get(std::vector<double,std::allocator<double>>*)::__0>
                  (in_stack_ffffffffffffffb8,in_RDI,__result,in_stack_ffffffffffffffa0);
        break;
      default:
        return false;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool InputSourcePreprocessingForFilterGain::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (!source_->Get(buffer)) {
    return false;
  }

  switch (gain_type_) {
    case kLinear: {
      // nothing to do
      break;
    }
    case kLog: {
      (*buffer)[0] = std::exp((*buffer)[0]);
      break;
    }
    case kInverse: {
      if (0.0 == (*buffer)[0]) return false;
      (*buffer)[0] = 1.0 / (*buffer)[0];
      break;
    }
    case kUnity: {
      (*buffer)[0] = 1.0;
      break;
    }
    case kUnityForAllZeroFilter: {
      if (0.0 == (*buffer)[0]) return false;
      const double inverse_of_b0(1.0 / (*buffer)[0]);
      std::transform(buffer->begin(), buffer->end(), buffer->begin(),
                     [inverse_of_b0](double x) { return x * inverse_of_b0; });
      break;
    }
    default: {
      return false;
    }
  }

  return true;
}